

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86.cpp
# Opt level: O2

int __thiscall ncnn::TanH_x86::forward_inplace(TanH_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  float *pfVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  iVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar10 = 0;
  uVar9 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar9 = uVar10;
  }
  for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
    pvVar1 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    pfVar5 = (float *)(sVar3 * uVar10 * sVar2 + (long)pvVar1);
    lVar8 = 0;
    for (iVar7 = 0; iVar7 + 3 < iVar6; iVar7 = iVar7 + 4) {
      auVar11._0_4_ = *pfVar5 * -2.0;
      auVar11._4_4_ = pfVar5[1] * -2.0;
      auVar11._8_4_ = pfVar5[2] * -2.0;
      auVar11._12_4_ = pfVar5[3] * -2.0;
      auVar12 = minps(auVar11,_DAT_004f1010);
      auVar12 = maxps(auVar12,_DAT_004f1020);
      fVar18 = auVar12._0_4_ * 1.442695 + 0.5;
      fVar20 = auVar12._4_4_ * 1.442695 + 0.5;
      fVar22 = auVar12._8_4_ * 1.442695 + 0.5;
      fVar23 = auVar12._12_4_ * 1.442695 + 0.5;
      fVar14 = (float)(int)fVar18;
      fVar15 = (float)(int)fVar20;
      fVar16 = (float)(int)fVar22;
      fVar17 = (float)(int)fVar23;
      fVar14 = fVar14 - (float)(-(uint)(fVar18 < fVar14) & 0x3f800000);
      fVar15 = fVar15 - (float)(-(uint)(fVar20 < fVar15) & 0x3f800000);
      fVar16 = fVar16 - (float)(-(uint)(fVar22 < fVar16) & 0x3f800000);
      fVar17 = fVar17 - (float)(-(uint)(fVar23 < fVar17) & 0x3f800000);
      fVar18 = fVar14 * -0.6931472 + auVar12._0_4_;
      fVar20 = fVar15 * -0.6931472 + auVar12._4_4_;
      fVar22 = fVar16 * -0.6931472 + auVar12._8_4_;
      fVar23 = fVar17 * -0.6931472 + auVar12._12_4_;
      auVar13._0_4_ = fVar18 * fVar18;
      auVar13._4_4_ = fVar20 * fVar20;
      auVar13._8_4_ = fVar22 * fVar22;
      auVar13._12_4_ = fVar23 * fVar23;
      fVar19 = (float)((int)fVar14 * 0x800000 + 0x3f800000) *
               (fVar18 + 1.0 +
               (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
                 0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5) * auVar13._0_4_) + 1.0;
      fVar21 = (float)((int)fVar15 * 0x800000 + 0x3f800000) *
               (fVar20 + 1.0 +
               (((((fVar20 * 0.00019875691 + 0.0013981999) * fVar20 + 0.008333452) * fVar20 +
                 0.041665796) * fVar20 + 0.16666666) * fVar20 + 0.5) * auVar13._4_4_) + 1.0;
      fVar16 = (float)((int)fVar16 * 0x800000 + 0x3f800000) *
               (fVar22 + 1.0 +
               (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 + 0.008333452) * fVar22 +
                 0.041665796) * fVar22 + 0.16666666) * fVar22 + 0.5) * auVar13._8_4_) + 1.0;
      fVar22 = (float)((int)fVar17 * 0x800000 + 0x3f800000) *
               (fVar23 + 1.0 +
               (((((fVar23 * 0.00019875691 + 0.0013981999) * fVar23 + 0.008333452) * fVar23 +
                 0.041665796) * fVar23 + 0.16666666) * fVar23 + 0.5) * auVar13._12_4_) + 1.0;
      auVar12._4_4_ = fVar21;
      auVar12._0_4_ = fVar19;
      auVar12._8_4_ = fVar16;
      auVar12._12_4_ = fVar22;
      auVar12 = rcpps(auVar13,auVar12);
      fVar14 = auVar12._0_4_;
      fVar18 = auVar12._4_4_;
      fVar15 = auVar12._8_4_;
      fVar20 = auVar12._12_4_;
      *pfVar5 = (2.0 - fVar19 * (fVar14 + fVar14)) * fVar14 + fVar14 + fVar14 + -1.0;
      pfVar5[1] = (2.0 - fVar21 * (fVar18 + fVar18)) * fVar18 + fVar18 + fVar18 + -1.0;
      pfVar5[2] = (2.0 - fVar16 * (fVar15 + fVar15)) * fVar15 + fVar15 + fVar15 + -1.0;
      pfVar5[3] = (2.0 - fVar22 * (fVar20 + fVar20)) * fVar20 + fVar20 + fVar20 + -1.0;
      pfVar5 = pfVar5 + 4;
      lVar8 = lVar8 + 4;
    }
    lVar4 = sVar3 * sVar2 * uVar10;
    for (; (int)lVar8 < iVar6; lVar8 = lVar8 + 1) {
      fVar14 = tanhf(*(float *)((long)pvVar1 + lVar8 * 4 + lVar4));
      *(float *)((long)pvVar1 + lVar8 * 4 + lVar4) = fVar14;
    }
  }
  return 0;
}

Assistant:

int TanH_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = tanh_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanhf(*ptr);
            ptr++;
        }
    }

    return 0;
}